

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * google::protobuf::compiler::js::anon_unknown_0::ToLowerCamel
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *words)

{
  long lVar1;
  string *psVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  string word;
  byte *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar2 = (words->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((words->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != psVar2) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      lVar1 = *(long *)((long)&(psVar2->_M_dataplus)._M_p + lVar4);
      local_50[0] = (byte *)local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,lVar1,*(long *)((long)&psVar2->_M_string_length + lVar4) + lVar1
                );
      bVar3 = *local_50[0];
      if (lVar4 == 0) {
        if ((byte)(bVar3 + 0xbf) < 0x1a) {
          bVar3 = bVar3 | 0x20;
          goto LAB_0022ad39;
        }
      }
      else if ((byte)(bVar3 + 0x9f) < 0x1a) {
        bVar3 = bVar3 - 0x20;
LAB_0022ad39:
        *local_50[0] = bVar3;
      }
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
      if (local_50[0] != (byte *)local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      uVar5 = uVar5 + 1;
      psVar2 = (words->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x20;
    } while (uVar5 < (ulong)((long)(words->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 5))
    ;
  }
  return psVar2;
}

Assistant:

string GetFilePath(const GeneratorOptions& options,
                   const FileDescriptor* file) {
  if (!options.namespace_prefix.empty()) {
    return options.namespace_prefix;
  } else if (!file->package().empty()) {
    return "proto." + file->package();
  } else {
    return "proto";
  }
}